

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createMap.hpp
# Opt level: O2

map<int,_njoy::ENDFtk::tree::File,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::File>_>_>
* __thiscall
njoy::ENDFtk::tree::Material::createMap<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (map<int,_njoy::ENDFtk::tree::File,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::File>_>_>
           *__return_storage_ptr__,Material *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *position,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *end,long *lineNumber)

{
  _Rb_tree_header *p_Var1;
  int args_1;
  bool bVar2;
  size_type sVar3;
  undefined8 *puVar4;
  char *in_stack_ffffffffffffff38;
  StructureDivision division;
  StructureDivision local_70;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  end->_M_current = end->_M_current + -1;
  *(HEAD **)begin._M_current = head;
  StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&division,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)begin._M_current,position,(long *)end);
  args_1 = (int)(this->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  do {
    if ((((division.tail.fields._M_elems[2] == 0) || (division.tail.fields._M_elems[1] == 0)) ||
        (division.tail.fields._M_elems[0] == 0)) || (division.tail.fields._M_elems[0] != args_1)) {
      bVar2 = StructureDivision::isMend(&division);
      if (!bVar2) {
        *(HEAD **)begin._M_current = head;
        tools::Log::info<char_const*,int>("The MEND record for MAT{} appears to be missing",args_1);
        tools::Log::info<char_const*,int,int,int,long>
                  ("Current position: MAT{} MF{} MT{} at line {}",division.tail.fields._M_elems[0],
                   division.tail.fields._M_elems[1],division.tail.fields._M_elems[2],
                   (long)end->_M_current);
      }
      return __return_storage_ptr__;
    }
    sVar3 = std::
            map<int,_njoy::ENDFtk::tree::File,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::File>_>_>
            ::count(__return_storage_ptr__,division.tail.fields._M_elems + 1);
    if (sVar3 != 0) {
      tools::Log::error<char_const*,int>
                ("Found a duplicate section for MF{}",division.tail.fields._M_elems[1]);
      tools::Log::info<char_const*,int,int,int,long>
                ("Current position: MAT{} MF{} MT{} at line {}",division.tail.fields._M_elems[0],
                 division.tail.fields._M_elems[1],division.tail.fields._M_elems[2],
                 (long)end->_M_current);
LAB_001873b4:
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = getenv;
      __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
    }
    File::File<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((File *)&local_70,(HEAD *)&division,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )head,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)begin._M_current,position,(long *)end);
    std::
    _Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::File>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::File>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::File>>>
    ::_M_emplace_unique<int&,njoy::ENDFtk::tree::File>
              ((_Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::File>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::File>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::File>>>
                *)__return_storage_ptr__,division.tail.fields._M_elems + 1,(File *)&local_70);
    std::
    _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::tree::Section>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::tree::Section>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>_>
                 *)((long)&local_70.base.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long> + 8));
    head = *(HEAD **)begin._M_current;
    if (position->_M_current <= head) {
      tools::Log::error<char_const*>(in_stack_ffffffffffffff38);
      goto LAB_001873b4;
    }
    StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&local_70,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)begin._M_current,position,(long *)end);
    StructureDivision::operator=(&division,&local_70);
    do {
      bVar2 = StructureDivision::isFend(&division);
      if (!bVar2) break;
      head = *(HEAD **)begin._M_current;
      StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (&local_70,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)begin._M_current,position,(long *)end);
      StructureDivision::operator=(&division,&local_70);
    } while (*begin._M_current < position->_M_current);
  } while( true );
}

Assistant:

static std::map< int, File >
createMap
( const HEAD& head, BufferIterator begin,
  BufferIterator& position, const BufferIterator& end, long& lineNumber ){

  std::map< int, File > files;

  // read the first HEAD record (we need a structure division)
  --lineNumber;
  position = begin;
  auto division = StructureDivision( position, end, lineNumber );

  // continue reading sections for the same mf
  auto mat = head.MAT();
  while ( division.isHead() && ( division.tail.MAT() == mat ) ) {

    // check for duplicate mf
    if ( files.count( division.tail.MF() ) ) {

      Log::error( "Found a duplicate section for MF{}", division.tail.MF() );
      Log::info( "Current position: MAT{} MF{} MT{} at line {}",
                 division.tail.MAT(), division.tail.MF(), division.tail.MT(),
                 lineNumber );
      throw std::exception();
    }

    // add the file
    files.emplace( division.tail.MF(),
                   File( asHead( division ),
                         begin, position, end, lineNumber ) );

    // check for end of stream
    if ( position >= end ) {

      Log::error( "Encountered the end of stream before a MEND record was found" );
      throw std::exception();
    }

    // skip any duplicate FEND records
    begin = position;
    division = StructureDivision( position, end, lineNumber );

    while ( division.isFend() ) {

      begin = position;
      division = StructureDivision( position, end, lineNumber );
      if ( position >= end ) {

        break;
      }
    }
  }

  // warn for missing MEND record
  if ( !division.isMend() ) {

    position = begin;
    Log::info( "The MEND record for MAT{} appears to be missing", mat );
    Log::info( "Current position: MAT{} MF{} MT{} at line {}",
               division.tail.MAT(), division.tail.MF(), division.tail.MT(),
               lineNumber );
  }

  return files;
}